

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlGlyphDefn::AssignGlyphAttrsToClassMembers
          (GdlGlyphDefn *this,GrcGlyphAttrMatrix *pgax,GdlRenderer *prndr,
          GrcLigComponentList *plclist,
          vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *vpglfaAttrs,
          int cgid,int *igid)

{
  undefined8 uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type_conflict sVar5;
  reference ppGVar6;
  undefined4 extraout_var;
  reference pvVar7;
  undefined4 extraout_var_00;
  Symbol in_RCX;
  long in_RDI;
  GdlDefn *in_R8;
  int in_R9D;
  int *in_stack_00000008;
  int ivComponent;
  GdlClassMemberExpression *pexpilThisGlyphId_1;
  GdlExpression *pexpThisGlyphId;
  int nStmtNoOld;
  GrpLineAndFile lnfOld;
  bool fShadow;
  bool fOverrideOld;
  int mPrUnitsOld;
  int nPROld;
  GdlExpression *pexpOld;
  size_t iwGlyphID;
  GdlClassMemberExpression *pexpilThisGlyphId;
  GdlClassMemberExpression *pexpilNew;
  int nStmtNoNew;
  GrpLineAndFile lnfNew;
  bool fOverrideNew;
  int mPrUnitsNew;
  int nPRNew;
  GdlExpression *pexpNew;
  GdlAssignment *pasgnValue;
  int nGlyphAttrID;
  Symbol psym;
  size_t ipglfa;
  int igidInitial;
  GdlExpression *in_stack_fffffffffffffde8;
  undefined4 uVar8;
  GrcManager *in_stack_fffffffffffffdf0;
  GrcSymbolTableEntry *this_00;
  GdlRenderer *in_stack_fffffffffffffe00;
  Symbol in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  value_type in_stack_fffffffffffffe16;
  Symbol in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  gid16 wGlyphID;
  Symbol in_stack_fffffffffffffe28;
  GdlClassMemberExpression *in_stack_fffffffffffffe40;
  GdlClassMemberExpression *in_stack_fffffffffffffe48;
  GdlClassMemberExpression *in_stack_fffffffffffffe50;
  GdlClassMemberExpression *local_190;
  GdlClassMemberExpression *local_178;
  allocator local_141;
  string local_140 [36];
  int local_11c;
  GdlClassMemberExpression *local_118;
  GdlClassMemberExpression *local_110;
  int local_104;
  undefined1 local_100 [47];
  undefined1 local_d1 [33];
  GdlClassMemberExpression *local_b0;
  int local_94;
  undefined1 local_90 [64];
  GrcAssignment *local_50;
  int local_44;
  Symbol local_40;
  ulong local_38;
  int local_30;
  int local_2c;
  GdlDefn *local_28;
  Symbol local_20;
  
  local_30 = *in_stack_00000008;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  for (local_38 = 0; uVar2 = local_38,
      sVar5 = std::vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>::size
                        ((vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *)
                         local_28), uVar2 < sVar5; local_38 = local_38 + 1) {
    ppGVar6 = std::vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>::operator[]
                        ((vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *)
                         local_28,local_38);
    local_40 = GdlGlyphAttrSetting::GlyphSymbol(*ppGVar6);
    local_44 = GrcSymbolTableEntry::InternalID(local_40);
    bVar3 = GrcManager::OffsetAttrs(&g_cman);
    if ((bVar3) ||
       (bVar3 = GrcSymbolTableEntry::IsIgnorableOffsetAttr
                          ((GrcSymbolTableEntry *)in_stack_fffffffffffffe00), !bVar3)) {
      ppGVar6 = std::vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>::
                operator[]((vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *)
                           local_28,local_38);
      local_50 = &GdlGlyphAttrSetting::Assignment(*ppGVar6)->super_GrcAssignment;
      local_90._56_8_ = GrcAssignment::Expression(local_50);
      local_90._52_4_ = GrcAssignment::PointRadius(local_50);
      local_90._48_4_ = GrcAssignment::PointRadiusUnits(local_50);
      local_90[0x2f] = GrcAssignment::Override(local_50);
      GrcAssignment::LineAndFile(local_50);
      GrpLineAndFile::GrpLineAndFile
                ((GrpLineAndFile *)
                 CONCAT26(in_stack_fffffffffffffe16,
                          CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)),
                 (GrpLineAndFile *)in_stack_fffffffffffffe08);
      local_94 = GrpLineAndFile::PreProcessedLine((GrpLineAndFile *)local_90);
      if ((GdlClassMemberExpression *)local_90._56_8_ == (GdlClassMemberExpression *)0x0) {
        local_178 = (GdlClassMemberExpression *)0x0;
      }
      else {
        local_178 = (GdlClassMemberExpression *)
                    __dynamic_cast(local_90._56_8_,&GdlExpression::typeinfo,
                                   &GdlClassMemberExpression::typeinfo,0);
      }
      local_b0 = local_178;
      if (local_178 != (GdlClassMemberExpression *)0x0) {
        GdlClassMemberExpression::SetClassSize(local_178,local_2c);
        iVar4 = GdlClassMemberExpression::GlyphIndex(local_b0);
        if ((iVar4 != -1) &&
           (iVar4 = GdlClassMemberExpression::GlyphIndex(local_b0), iVar4 != *in_stack_00000008)) {
          iVar4 = (**(local_b0->super_GdlLookupExpression).super_GdlExpression._vptr_GdlExpression)
                            ();
          if (CONCAT44(extraout_var,iVar4) == 0) {
            local_190 = (GdlClassMemberExpression *)0x0;
          }
          else {
            local_190 = (GdlClassMemberExpression *)
                        __dynamic_cast(CONCAT44(extraout_var,iVar4),&GdlExpression::typeinfo,
                                       &GdlClassMemberExpression::typeinfo,0);
          }
          local_d1._25_8_ = local_190;
          local_b0 = local_190;
          local_90._56_8_ = local_190;
          GrcManager::StoreModifiedExpression(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        }
        GdlClassMemberExpression::SetGlyphIndex(local_b0,*in_stack_00000008);
      }
      *in_stack_00000008 = local_30;
      for (local_d1._17_8_ = 0; uVar1 = local_d1._17_8_,
          sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             (in_RDI + 0x70)), (ulong)uVar1 < sVar5;
          local_d1._17_8_ = local_d1._17_8_ + 1) {
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x70),local_d1._17_8_);
        wGlyphID = (gid16)((uint)in_stack_fffffffffffffe24 >> 0x10);
        if (*pvVar7 != 0xfffb) {
          GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x143f40);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70),
                     local_d1._17_8_);
          this_00 = (GrcSymbolTableEntry *)local_100;
          in_stack_fffffffffffffdf0 = (GrcManager *)(local_100 + 0x2e);
          in_stack_fffffffffffffde8 = (GdlExpression *)local_d1;
          GrcGlyphAttrMatrix::Get
                    ((GrcGlyphAttrMatrix *)in_stack_fffffffffffffe28,wGlyphID,
                     in_stack_fffffffffffffe20,(GdlExpression **)in_stack_fffffffffffffe18,
                     (int *)CONCAT26(in_stack_fffffffffffffe16,
                                     CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)),
                     (int *)in_stack_fffffffffffffe08,(bool *)in_stack_fffffffffffffe40,
                     (bool *)in_stack_fffffffffffffe48,(GrpLineAndFile *)in_stack_fffffffffffffe50);
          local_104 = GrpLineAndFile::PreProcessedLine((GrpLineAndFile *)local_100);
          if (((local_d1._9_8_ == 0) || ((local_104 < local_94 && ((local_90[0x2f] & 1) != 0)))) ||
             ((local_94 < local_104 && ((local_d1[0] & 1) == 0)))) {
            local_110 = (GdlClassMemberExpression *)local_90._56_8_;
            if ((local_b0 != (GdlClassMemberExpression *)0x0) &&
               (iVar4 = GdlClassMemberExpression::GlyphIndex(local_b0), iVar4 != *in_stack_00000008)
               ) {
              iVar4 = (**(((GdlLookupExpression *)local_90._56_8_)->super_GdlExpression).
                         _vptr_GdlExpression)();
              in_stack_fffffffffffffe48 =
                   (GdlClassMemberExpression *)CONCAT44(extraout_var_00,iVar4);
              in_stack_fffffffffffffe50 = in_stack_fffffffffffffe48;
              local_110 = in_stack_fffffffffffffe48;
              if (in_stack_fffffffffffffe48 == (GdlClassMemberExpression *)0x0) {
                in_stack_fffffffffffffe40 = (GdlClassMemberExpression *)0x0;
              }
              else {
                in_stack_fffffffffffffe40 =
                     (GdlClassMemberExpression *)
                     __dynamic_cast(in_stack_fffffffffffffe48,&GdlExpression::typeinfo,
                                    &GdlClassMemberExpression::typeinfo,0);
              }
              local_118 = in_stack_fffffffffffffe40;
              GdlClassMemberExpression::SetGlyphIndex(in_stack_fffffffffffffe40,*in_stack_00000008);
              GrcManager::StoreModifiedExpression
                        (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            }
            uVar8 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70),
                       local_d1._17_8_);
            this_00 = (GrcSymbolTableEntry *)local_90;
            in_stack_fffffffffffffde8 =
                 (GdlExpression *)(CONCAT44(uVar8,(uint)local_90[0x2f]) & 0xffffffff00000001);
            in_stack_fffffffffffffdf0 =
                 (GrcManager *)((ulong)in_stack_fffffffffffffdf0 & 0xffffffff00000000);
            GrcGlyphAttrMatrix::Set
                      ((GrcGlyphAttrMatrix *)in_stack_fffffffffffffe28,wGlyphID,
                       in_stack_fffffffffffffe20,(GdlExpression *)in_stack_fffffffffffffe18,
                       CONCAT22(in_stack_fffffffffffffe16,in_stack_fffffffffffffe14),
                       in_stack_fffffffffffffe10,SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffffe08 >> 0x30,0),
                       (GrpLineAndFile *)in_stack_fffffffffffffe50);
          }
          in_stack_fffffffffffffe28 = local_40;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_140,"component",&local_141);
          in_stack_fffffffffffffe24 =
               GrcSymbolTableEntry::FieldIndex
                         ((GrcSymbolTableEntry *)in_stack_fffffffffffffe00,&this_00->m_staFieldName)
          ;
          std::__cxx11::string::~string(local_140);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          local_11c = in_stack_fffffffffffffe24;
          if (-1 < in_stack_fffffffffffffe24) {
            in_stack_fffffffffffffe08 = local_20;
            pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                (in_RDI + 0x70),local_d1._17_8_);
            in_stack_fffffffffffffe16 = *pvVar7;
            in_stack_fffffffffffffe18 = GrcSymbolTableEntry::Generic(local_40);
            in_stack_fffffffffffffe00 =
                 (GdlRenderer *)GrcSymbolTableEntry::BaseLigComponent(this_00);
            GrcLigComponentList::AddComponentFor
                      ((GrcLigComponentList *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe16,
                       in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          }
          *in_stack_00000008 = *in_stack_00000008 + 1;
          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1442fa);
        }
      }
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x14432f);
    }
  }
  return;
}

Assistant:

void GdlGlyphDefn::AssignGlyphAttrsToClassMembers(GrcGlyphAttrMatrix * pgax,
	GdlRenderer * prndr, GrcLigComponentList * plclist,
	std::vector<GdlGlyphAttrSetting *> & vpglfaAttrs, int cgid, int & igid)
{
	int igidInitial = igid;

	//	For each attribute assignment in the value list:
	for (size_t ipglfa = 0; ipglfa < vpglfaAttrs.size(); ipglfa++)
	{
		Symbol psym = vpglfaAttrs[ipglfa]->GlyphSymbol();
		Assert(!psym->IsGeneric());
		int nGlyphAttrID = psym->InternalID();

		if (!g_cman.OffsetAttrs() && psym->IsIgnorableOffsetAttr())
			continue;

		//	The new attribute assignment:
		GdlAssignment * pasgnValue = vpglfaAttrs[ipglfa]->Assignment();
		GdlExpression * pexpNew = pasgnValue->Expression();
		int nPRNew = pasgnValue->PointRadius();
		int mPrUnitsNew = pasgnValue->PointRadiusUnits();
		bool fOverrideNew = pasgnValue->Override();
		GrpLineAndFile lnfNew = pasgnValue->LineAndFile();
		int nStmtNoNew = lnfNew.PreProcessedLine();

		GdlClassMemberExpression * pexpilNew = dynamic_cast<GdlClassMemberExpression *>(pexpNew);
		if (pexpilNew)
		{
			Assert(pexpilNew->Name()->FitsSymbolType(ksymtClass));
			pexpilNew->SetClassSize(cgid);
			if (pexpilNew->GlyphIndex() != -1 && pexpilNew->GlyphIndex() != igid)
			{
				//	Make a copy for this specific glyph definition.
				GdlClassMemberExpression * pexpilThisGlyphId 
					= dynamic_cast<GdlClassMemberExpression *>(pexpilNew->Clone());
				pexpilNew = pexpilThisGlyphId;
				pexpNew = dynamic_cast<GdlExpression *>(pexpilNew);
				g_cman.StoreModifiedExpression(pexpNew);
			}
			pexpilNew->SetGlyphIndex(igid);
		}

		igid = igidInitial;	// start over for each attribute

		//	For each glyph ID covered by this definition's range:
		for (size_t iwGlyphID = 0; iwGlyphID < m_vwGlyphIDs.size(); iwGlyphID++)
		{
			if (m_vwGlyphIDs[iwGlyphID] == kBadGlyph) // invalid glyph
				continue;

			//	Compare the new assignment with the previous.
			GdlExpression * pexpOld;
			int nPROld;
			int mPrUnitsOld;
			bool fOverrideOld, fShadow;
			GrpLineAndFile lnfOld;
			pgax->Get(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
				&pexpOld, &nPROld, &mPrUnitsOld, &fOverrideOld, &fShadow, &lnfOld);
			int nStmtNoOld = lnfOld.PreProcessedLine();
			Assert(!fShadow);

			if (pexpOld == NULL ||
				(nStmtNoNew > nStmtNoOld && fOverrideNew) ||
				(nStmtNoOld > nStmtNoNew && !fOverrideOld))
			{
				// For indexed-lookup expressions, we need to make a separate copy 
				// for each individual glyph ID.
				GdlExpression * pexpThisGlyphId = pexpNew;
				if (pexpilNew && pexpilNew->GlyphIndex() != igid)
				{
					//	Make a copy for this specific glyph ID.
					pexpThisGlyphId = pexpNew->Clone();
					GdlClassMemberExpression * pexpilThisGlyphId 
						= dynamic_cast<GdlClassMemberExpression *>(pexpThisGlyphId);
					pexpilThisGlyphId->SetGlyphIndex(igid);
					g_cman.StoreModifiedExpression(pexpThisGlyphId);
				}

				//	The current attribute assignment overrides the previous--set it.
				pgax->Set(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
					pexpThisGlyphId, nPRNew, mPrUnitsNew, fOverrideNew, false, lnfNew);
			}

			//	If this glyph is a ligature, add the given component to its list.
			int ivComponent = psym->FieldIndex("component");
			if (ivComponent > -1)
			{
				plclist->AddComponentFor(m_vwGlyphIDs[iwGlyphID],
					psym->Generic()->BaseLigComponent(), prndr);
			}

			igid++;
		}
	}
}